

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int sam_hdr_write(htsFile *fp,bam_hdr_t *h)

{
  byte bVar1;
  uint uVar2;
  cram_fd *fd;
  hFILE *phVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  SAM_hdr *hdr;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  byte *pbVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  char buf [16];
  undefined8 local_50;
  byte abStack_48 [24];
  
  switch((fp->format).format) {
  case binary_format:
    (fp->format).category = sequence_data;
    (fp->format).format = bam;
  case bam:
    bam_hdr_write((fp->fp).bgzf,h);
    break;
  case text_format:
    (fp->format).category = sequence_data;
    (fp->format).format = sam;
  case sam:
    pcVar8 = h->text;
    phVar3 = (fp->fp).hfile;
    sVar7 = strlen(pcVar8);
    uVar15 = (long)phVar3->limit - (long)phVar3->begin;
    sVar9 = sVar7;
    if (uVar15 < sVar7) {
      sVar9 = uVar15;
    }
    memcpy(phVar3->begin,pcVar8,sVar9);
    phVar3->begin = phVar3->begin + sVar9;
    if (uVar15 < sVar7) {
      hputs2(pcVar8,sVar7,sVar9,phVar3);
    }
    pcVar8 = strstr(h->text,"@SQ\t");
    if ((pcVar8 == (char *)0x0) && (0 < h->n_targets)) {
      lVar14 = 0;
      do {
        (fp->line).l = 0;
        if ((fp->line).m < 9) {
          (fp->line).m = 0x10;
          pcVar8 = (char *)realloc((fp->line).s,0x10);
          if (pcVar8 != (char *)0x0) {
            (fp->line).s = pcVar8;
            sVar13 = (fp->line).l;
            goto LAB_00112cd9;
          }
        }
        else {
          pcVar8 = (fp->line).s;
          sVar13 = 0;
LAB_00112cd9:
          builtin_strncpy(pcVar8 + sVar13,"@SQ\tSN:",7);
          sVar13 = (fp->line).l;
          (fp->line).l = sVar13 + 7;
          (fp->line).s[sVar13 + 7] = '\0';
        }
        pcVar8 = h->target_name[lVar14];
        sVar9 = strlen(pcVar8);
        sVar13 = (fp->line).l;
        sVar9 = (size_t)(int)sVar9;
        uVar15 = sVar13 + sVar9 + 1;
        if (uVar15 < (fp->line).m) {
          pcVar10 = (fp->line).s;
LAB_00112d75:
          memcpy(pcVar10 + sVar13,pcVar8,sVar9);
          sVar13 = sVar9 + (fp->line).l;
          (fp->line).l = sVar13;
          (fp->line).s[sVar13] = '\0';
        }
        else {
          uVar15 = uVar15 >> 1 | uVar15;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          sVar7 = (uVar15 >> 0x10 | uVar15) + 1;
          (fp->line).m = sVar7;
          pcVar10 = (char *)realloc((fp->line).s,sVar7);
          if (pcVar10 != (char *)0x0) {
            (fp->line).s = pcVar10;
            sVar13 = (fp->line).l;
            goto LAB_00112d75;
          }
        }
        sVar13 = (fp->line).l;
        uVar15 = sVar13 + 5;
        if (uVar15 < (fp->line).m) {
          pcVar8 = (fp->line).s;
LAB_00112df6:
          builtin_strncpy(pcVar8 + sVar13,"\tLN:",4);
          sVar13 = (fp->line).l;
          (fp->line).l = sVar13 + 4;
          (fp->line).s[sVar13 + 4] = '\0';
        }
        else {
          uVar15 = uVar15 >> 1 | uVar15;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          sVar9 = (uVar15 >> 0x10 | uVar15) + 1;
          (fp->line).m = sVar9;
          pcVar8 = (char *)realloc((fp->line).s,sVar9);
          if (pcVar8 != (char *)0x0) {
            (fp->line).s = pcVar8;
            sVar13 = (fp->line).l;
            goto LAB_00112df6;
          }
        }
        uVar2 = h->target_len[lVar14];
        uVar5 = -uVar2;
        if (0 < (int)uVar2) {
          uVar5 = uVar2;
        }
        uVar15 = 0;
        do {
          abStack_48[uVar15] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
          uVar15 = uVar15 + 1;
          bVar4 = 9 < uVar5;
          uVar5 = uVar5 / 10;
        } while (bVar4);
        if ((int)uVar2 < 0) {
          uVar11 = uVar15 & 0xffffffff;
          uVar15 = (ulong)((int)uVar15 + 1);
          abStack_48[uVar11] = 0x2d;
        }
        uVar11 = (fp->line).l + (long)(int)uVar15 + 1;
        if (uVar11 < (fp->line).m) {
LAB_00112eb7:
          pbVar12 = abStack_48 + ((uVar15 & 0xffffffff) - 1);
          iVar6 = (int)uVar15 + 1;
          do {
            bVar1 = *pbVar12;
            sVar13 = (fp->line).l;
            (fp->line).l = sVar13 + 1;
            (fp->line).s[sVar13] = bVar1;
            iVar6 = iVar6 + -1;
            pbVar12 = pbVar12 + -1;
          } while (1 < iVar6);
          (fp->line).s[(fp->line).l] = '\0';
        }
        else {
          uVar11 = uVar11 >> 1 | uVar11;
          uVar11 = uVar11 >> 2 | uVar11;
          uVar11 = uVar11 >> 4 | uVar11;
          uVar11 = uVar11 >> 8 | uVar11;
          sVar9 = (uVar11 >> 0x10 | uVar11) + 1;
          (fp->line).m = sVar9;
          pcVar8 = (char *)realloc((fp->line).s,sVar9);
          if (pcVar8 != (char *)0x0) {
            (fp->line).s = pcVar8;
            goto LAB_00112eb7;
          }
        }
        sVar13 = (fp->line).l;
        uVar15 = sVar13 + 1;
        if (uVar15 < (fp->line).m) {
          pcVar8 = (fp->line).s;
LAB_00112f58:
          (fp->line).l = uVar15;
          pcVar8[sVar13] = '\n';
          (fp->line).s[(fp->line).l] = '\0';
        }
        else {
          uVar15 = uVar15 >> 1 | uVar15;
          uVar15 = uVar15 >> 2 | uVar15;
          uVar15 = uVar15 >> 4 | uVar15;
          uVar15 = uVar15 >> 8 | uVar15;
          sVar9 = (uVar15 >> 0x10 | uVar15) + 1;
          (fp->line).m = sVar9;
          pcVar8 = (char *)realloc((fp->line).s,sVar9);
          if (pcVar8 != (char *)0x0) {
            (fp->line).s = pcVar8;
            sVar13 = (fp->line).l;
            uVar15 = sVar13 + 1;
            goto LAB_00112f58;
          }
        }
        phVar3 = (fp->fp).hfile;
        uVar15 = (fp->line).l;
        pcVar8 = (fp->line).s;
        uVar16 = (long)phVar3->limit - (long)phVar3->begin;
        uVar11 = uVar15;
        if (uVar16 < uVar15) {
          uVar11 = uVar16;
        }
        local_50 = lVar14;
        memcpy(phVar3->begin,pcVar8,uVar11);
        phVar3->begin = phVar3->begin + uVar11;
        if (uVar16 < uVar15) {
          uVar11 = hwrite2(phVar3,pcVar8,uVar15,uVar11);
        }
        if (uVar11 != (fp->line).l) {
          return -1;
        }
        lVar14 = local_50 + 1;
      } while (lVar14 < h->n_targets);
    }
    iVar6 = hflush((fp->fp).hfile);
    if (iVar6 != 0) {
      return -1;
    }
    break;
  default:
    abort();
  case cram:
    fd = (fp->fp).cram;
    hdr = bam_header_to_cram(h);
    iVar6 = cram_set_header(fd,hdr);
    if (iVar6 < 0) {
      return -1;
    }
    if (fp->fn_aux != (char *)0x0) {
      cram_load_reference(fd,fp->fn_aux);
    }
    iVar6 = cram_write_SAM_hdr(fd,fd->header);
    if (iVar6 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int sam_hdr_write(htsFile *fp, const bam_hdr_t *h)
{
    switch (fp->format.format) {
    case binary_format:
        fp->format.category = sequence_data;
        fp->format.format = bam;
        /* fall-through */
    case bam:
        bam_hdr_write(fp->fp.bgzf, h);
        break;

    case cram: {
        cram_fd *fd = fp->fp.cram;
        if (cram_set_header(fd, bam_header_to_cram((bam_hdr_t *)h)) < 0) return -1;
        if (fp->fn_aux)
            cram_load_reference(fd, fp->fn_aux);
        if (cram_write_SAM_hdr(fd, fd->header) < 0) return -1;
        }
        break;

    case text_format:
        fp->format.category = sequence_data;
        fp->format.format = sam;
        /* fall-through */
    case sam: {
        char *p;
        hputs(h->text, fp->fp.hfile);
        p = strstr(h->text, "@SQ\t"); // FIXME: we need a loop to make sure "@SQ\t" does not match something unwanted!!!
        if (p == 0) {
            int i;
            for (i = 0; i < h->n_targets; ++i) {
                fp->line.l = 0;
                kputsn("@SQ\tSN:", 7, &fp->line); kputs(h->target_name[i], &fp->line);
                kputsn("\tLN:", 4, &fp->line); kputw(h->target_len[i], &fp->line); kputc('\n', &fp->line);
                if ( hwrite(fp->fp.hfile, fp->line.s, fp->line.l) != fp->line.l ) return -1;
            }
        }
        if ( hflush(fp->fp.hfile) != 0 ) return -1;
        }
        break;

    default:
        abort();
    }
    return 0;
}